

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallExportGenerator.cxx
# Opt level: O2

string * __thiscall
cmInstallExportGenerator::GetDestinationFile_abi_cxx11_
          (string *__return_storage_ptr__,cmInstallExportGenerator *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  std::operator+(&bStack_38,&(this->super_cmInstallGenerator).Destination,'/');
  std::operator+(__return_storage_ptr__,&bStack_38,&this->FileName);
  std::__cxx11::string::~string((string *)&bStack_38);
  return __return_storage_ptr__;
}

Assistant:

std::string cmInstallExportGenerator::GetDestinationFile() const
{
  return this->Destination + '/' + this->FileName;
}